

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O1

void TM4_SSE2(uint8_t *dst)

{
  undefined4 uVar1;
  long lVar2;
  short sVar3;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar4 [16];
  
  uVar1 = *(undefined4 *)(dst + -0x20);
  lVar2 = 0;
  do {
    auVar4 = pshuflw(ZEXT416((uint)dst[lVar2 + -1] - (uint)dst[-0x21]),
                     ZEXT416((uint)dst[lVar2 + -1] - (uint)dst[-0x21]),0);
    sVar3 = auVar4._0_2_ + (ushort)(byte)uVar1;
    sVar5 = auVar4._2_2_ + (ushort)(byte)((uint)uVar1 >> 8);
    sVar6 = auVar4._4_2_ + (ushort)(byte)((uint)uVar1 >> 0x10);
    sVar7 = auVar4._6_2_ + (ushort)(byte)((uint)uVar1 >> 0x18);
    *(uint *)(dst + lVar2) =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)sVar5 - (0xff < sVar5),
                                    (0 < sVar3) * (sVar3 < 0x100) * (char)sVar3 - (0xff < sVar3))));
    lVar2 = lVar2 + 0x20;
  } while ((int)lVar2 != 0x80);
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion_SSE2(uint8_t* dst, int size) {
  const uint8_t* top = dst - BPS;
  const __m128i zero = _mm_setzero_si128();
  int y;
  if (size == 4) {
    const __m128i top_values = _mm_cvtsi32_si128(WebPMemToUint32(top));
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 4; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      WebPUint32ToMem(dst, _mm_cvtsi128_si32(out));
    }
  } else if (size == 8) {
    const __m128i top_values = _mm_loadl_epi64((const __m128i*)top);
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 8; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      _mm_storel_epi64((__m128i*)dst, out);
    }
  } else {
    const __m128i top_values = _mm_loadu_si128((const __m128i*)top);
    const __m128i top_base_0 = _mm_unpacklo_epi8(top_values, zero);
    const __m128i top_base_1 = _mm_unpackhi_epi8(top_values, zero);
    for (y = 0; y < 16; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out_0 = _mm_add_epi16(base, top_base_0);
      const __m128i out_1 = _mm_add_epi16(base, top_base_1);
      const __m128i out = _mm_packus_epi16(out_0, out_1);
      _mm_storeu_si128((__m128i*)dst, out);
    }
  }
}